

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void CleanSpaces(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Bool BVar5;
  uint uVar6;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      BVar5 = prvTidynodeIsText(node);
      if (((BVar5 != no) && (BVar5 = prvTidynodeIsText(node), BVar5 != no)) &&
         (pNVar2 = node->parent, pNVar4 = pNVar2, pNVar2->type != DocTypeTag)) {
        for (; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->parent) {
          if ((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->parser == prvTidyParsePre))
          goto LAB_0014312f;
        }
        if ((pNVar2->tag == (Dict *)0x0) || (pNVar2->tag->parser != prvTidyParseScript)) {
          if (node->prev == (Node *)0x0) {
            BVar5 = prvTidynodeHasCM(pNVar2,0x10);
            if (BVar5 != no) goto LAB_001432c8;
          }
          else {
            pDVar3 = node->prev->tag;
            if ((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_BR)) {
LAB_001432c8:
              if (((node->prev == (Node *)0x0) ||
                  ((BVar5 = prvTidynodeHasCM(node->prev,0x10), BVar5 != no ||
                   (BVar5 = prvTidynodeIsElement(node->prev), BVar5 == no)))) &&
                 ((node->prev != (Node *)0x0 ||
                  ((node->parent->prev != (Node *)0x0 ||
                   (BVar5 = prvTidynodeHasCM(node->parent->parent,0x10), BVar5 != no))))))
              goto LAB_0014312f;
            }
          }
          uVar6 = node->start;
          while ((uVar6 < node->end &&
                 (BVar5 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar6]), BVar5 != no))) {
            uVar6 = node->start + 1;
            node->start = uVar6;
          }
        }
      }
LAB_0014312f:
      BVar5 = prvTidynodeIsText(node);
      if (((BVar5 != no) && (BVar5 = prvTidynodeIsText(node), BVar5 != no)) &&
         (pNVar2 = node->parent, pNVar4 = pNVar2, pNVar2->type != DocTypeTag)) {
        for (; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->parent) {
          if ((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->parser == prvTidyParsePre))
          goto LAB_00143154;
        }
        if ((pNVar2->tag == (Dict *)0x0) || (pNVar2->tag->parser != prvTidyParseScript)) {
          pNVar4 = node->next;
          if (pNVar4 == (Node *)0x0) {
            BVar5 = prvTidynodeHasCM(pNVar2,0x10);
            if ((BVar5 == no) ||
               ((pNVar2 = node->parent->next, pNVar2 != (Node *)0x0 &&
                (BVar5 = prvTidynodeHasCM(pNVar2,0x10), BVar5 == no)))) goto LAB_00143343;
          }
          else if (((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->id == TidyTag_BR)) ||
                  ((BVar5 = prvTidynodeHasCM(pNVar4,0x10), BVar5 == no &&
                   (((pNVar4->type | CommentTag) == StartEndTag ||
                    (((BVar5 = prvTidynodeIsText(pNVar4), BVar5 != no &&
                      (pNVar4->start < pNVar4->end)) &&
                     (BVar5 = prvTidyIsWhite((int)doc->lexer->lexbuf[pNVar4->start]), BVar5 != no)))
                    ))))) {
LAB_00143343:
            uVar6 = node->end;
            while ((node->start < uVar6 &&
                   (BVar5 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar6 - 1]), BVar5 != no))) {
              uVar6 = node->end - 1;
              node->end = uVar6;
            }
          }
        }
      }
LAB_00143154:
      BVar5 = prvTidynodeIsText(node);
      if ((BVar5 == no) || (node->start < node->end)) {
        if (node->content != (Node *)0x0) {
          CleanSpaces(doc,node->content);
        }
      }
      else {
        prvTidyRemoveNode(node);
        prvTidyFreeNode(doc,node);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

static void CleanSpaces(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node) && CleanLeadingWhitespace(doc, node))
            while (node->start < node->end && TY_(IsWhite)(doc->lexer->lexbuf[node->start]))
                ++(node->start);

        if (TY_(nodeIsText)(node) && CleanTrailingWhitespace(doc, node))
            while (node->end > node->start && TY_(IsWhite)(doc->lexer->lexbuf[node->end - 1]))
                --(node->end);

        if (TY_(nodeIsText)(node) && !(node->start < node->end))
        {
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;

            continue;
        }

        if (node->content)
            CleanSpaces(doc, node->content);

        node = next;
    }
}